

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_name_formatter.cpp
# Opt level: O3

string * __thiscall
dpfb::ImageNameFormatter::getImageName_abi_cxx11_
          (string *__return_storage_ptr__,ImageNameFormatter *this,size_t imageIdx)

{
  size_type sVar1;
  pointer pcVar2;
  __string_type __str;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = (this->prefix)._M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (this->prefix)._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::_M_replace_aux((ulong)&local_48,local_48._M_string_length,0,'\x01');
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  str::format_abi_cxx11_(&local_48,"%0*zu",(ulong)(uint)this->numDigits,imageIdx);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->extension)._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageNameFormatter::getImageName(std::size_t imageIdx) const
{
    std::string result;

    if (!prefix.empty())
        result += prefix + '_';

    result += str::format("%0*zu", numDigits, imageIdx);
    result += extension;

    return result;
}